

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::CanShortcutInstanceOnUnknownPropertyName(RecyclableObject *instance)

{
  bool bVar1;
  TypeId typeId_00;
  BOOL BVar2;
  int iVar3;
  DynamicTypeHandler *pDVar4;
  bool local_39;
  JavascriptFunction *local_38;
  JavascriptFunction *function;
  TypeId typeId;
  RecyclableObject *instance_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,OptUnknownElementNamePhase);
  if (bVar1) {
    instance_local._7_1_ = false;
  }
  else {
    typeId_00 = RecyclableObject::GetTypeId(instance);
    if ((typeId_00 == TypeIds_Proxy) || (typeId_00 == TypeIds_HostDispatch)) {
      instance_local._7_1_ = false;
    }
    else {
      bVar1 = DynamicType::Is(typeId_00);
      if (bVar1) {
        pDVar4 = DynamicObject::GetTypeHandler((DynamicObject *)instance);
        iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[2])();
        if (iVar3 != 0) {
          return false;
        }
      }
      BVar2 = RecyclableObject::IsExternal(instance);
      if (BVar2 == 0) {
        iVar3 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x5a])();
        if (iVar3 == 0) {
          bVar1 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(instance);
          if (bVar1) {
            local_38 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(instance);
          }
          else {
            local_38 = (JavascriptFunction *)0x0;
          }
          local_39 = false;
          if (local_38 != (JavascriptFunction *)0x0) {
            iVar3 = (*(local_38->super_DynamicObject).super_RecyclableObject.super_FinalizableObject
                      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])();
            local_39 = iVar3 != 0;
          }
          instance_local._7_1_ = local_39;
        }
        else {
          instance_local._7_1_ = false;
        }
      }
      else {
        instance_local._7_1_ = false;
      }
    }
  }
  return instance_local._7_1_;
}

Assistant:

bool JavascriptOperators::CanShortcutInstanceOnUnknownPropertyName(RecyclableObject *instance)
    {
        if (PHASE_OFF1(Js::OptUnknownElementNamePhase))
        {
            return false;
        }

        TypeId typeId = instance->GetTypeId();
        if (typeId == TypeIds_Proxy || typeId == TypeIds_HostDispatch)
        {
            return false;
        }
        if (DynamicType::Is(typeId) &&
            static_cast<DynamicObject*>(instance)->GetTypeHandler()->IsStringTypeHandler())
        {
            return false;
        }
        if (instance->IsExternal())
        {
            return false;
        }

        if (!(instance->HasDeferredTypeHandler()))
        {
            JavascriptFunction * function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
            return function && function->IsExternalFunction();
        }
        return false;
    }